

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

optional<unsigned_int> wasm::String::anon_unknown_0::takeWTF8CodePoint(string_view *str)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  size_type sVar1;
  byte *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  int local_94;
  int local_90;
  int local_8c;
  size_t expectedTrailing;
  size_t local_68;
  char *local_60;
  ulong uStack_50;
  uint8_t trailing;
  size_t j;
  size_t local_40;
  char *local_38;
  uint local_2c;
  ulong uStack_28;
  uint32_t u;
  size_t trailingBytes;
  uint8_t leading;
  string_view *psStack_18;
  bool valid;
  string_view *str_local;
  
  trailingBytes._7_1_ = 1;
  psStack_18 = str;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(str);
  if (sVar1 == 0) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
  }
  else {
    pbVar2 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[](psStack_18,0)
    ;
    trailingBytes._5_1_ = *pbVar2;
    local_2c = 0;
    if ((trailingBytes._5_1_ & 0x80) == 0) {
      uStack_28 = 0;
      local_2c = (uint)trailingBytes._5_1_;
    }
    else if ((trailingBytes._5_1_ & 0xe0) == 0xc0) {
      uStack_28 = 1;
      local_2c = (trailingBytes._5_1_ & 0x1f) << 6;
    }
    else if ((trailingBytes._5_1_ & 0xf0) == 0xe0) {
      uStack_28 = 2;
      local_2c = (trailingBytes._5_1_ & 0xf) << 0xc;
    }
    else if ((trailingBytes._5_1_ & 0xf8) == 0xf0) {
      uStack_28 = 3;
      local_2c = (trailingBytes._5_1_ & 7) << 0x12;
    }
    else {
      uStack_28 = 0;
      trailingBytes._7_1_ = 0;
    }
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(psStack_18);
    this = psStack_18;
    if (uStack_28 < sVar1) {
      if ((trailingBytes._7_1_ & 1) != 0) {
        for (uStack_50 = 0; uStack_50 < uStack_28; uStack_50 = uStack_50 + 1) {
          pbVar2 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                     (psStack_18,uStack_50 + 1);
          if ((*pbVar2 & 0xc0) != 0x80) {
            trailingBytes._7_1_ = 0;
            break;
          }
          local_2c = (*pbVar2 & 0x3f) <<
                     ((((char)uStack_28 - (char)uStack_50) + -1) * '\x06' & 0x1fU) | local_2c;
        }
      }
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (psStack_18,uStack_28 + 1,0xffffffffffffffff);
      local_68 = bVar3._M_len;
      psStack_18->_M_len = local_68;
      local_60 = bVar3._M_str;
      psStack_18->_M_str = local_60;
      if ((trailingBytes._7_1_ & 1) == 0) {
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
      }
      else {
        if (local_2c < 0x80) {
          local_8c = 0;
        }
        else {
          if (local_2c < 0x800) {
            local_90 = 1;
          }
          else {
            if (local_2c < 0x10000) {
              local_94 = 2;
            }
            else {
              local_94 = -1;
              if (local_2c < 0x110000) {
                local_94 = 3;
              }
            }
            local_90 = local_94;
          }
          local_8c = local_90;
        }
        if (uStack_28 == (long)local_8c) {
          std::optional<unsigned_int>::optional<unsigned_int,_true>
                    ((optional<unsigned_int> *)&str_local,&local_2c);
        }
        else {
          std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
        }
      }
    }
    else {
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(psStack_18);
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this,sVar1,0xffffffffffffffff);
      local_40 = bVar3._M_len;
      psStack_18->_M_len = local_40;
      local_38 = bVar3._M_str;
      psStack_18->_M_str = local_38;
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
    }
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)str_local;
}

Assistant:

std::optional<uint32_t> takeWTF8CodePoint(std::string_view& str) {
  bool valid = true;

  if (str.size() == 0) {
    return std::nullopt;
  }

  uint8_t leading = str[0];
  size_t trailingBytes;
  // Initialized only to avoid spurious compiler warnings.
  uint32_t u = 0;
  if ((leading & 0b10000000) == 0b00000000) {
    // 0xxxxxxx
    trailingBytes = 0;
    u = leading;
  } else if ((leading & 0b11100000) == 0b11000000) {
    // 110xxxxx 10xxxxxx
    trailingBytes = 1;
    u = (leading & 0b00011111) << 6;
  } else if ((leading & 0b11110000) == 0b11100000) {
    // 1110xxxx 10xxxxxx 10xxxxxx
    trailingBytes = 2;
    u = (leading & 0b00001111) << 12;
  } else if ((leading & 0b11111000) == 0b11110000) {
    // 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
    trailingBytes = 3;
    u = (leading & 0b00000111) << 18;
  } else {
    // Bad WTF-8 leading byte.
    trailingBytes = 0;
    valid = false;
  }

  if (str.size() <= trailingBytes) {
    // Unexpected end of string.
    str = str.substr(str.size());
    return std::nullopt;
  }

  if (valid) {
    for (size_t j = 0; j < trailingBytes; ++j) {
      uint8_t trailing = str[1 + j];
      if ((trailing & 0b11000000) != 0b10000000) {
        // Bad WTF-8 trailing byte.
        valid = false;
        break;
      }
      // Shift 6 bits for every remaining trailing byte after this one.
      u |= (trailing & 0b00111111) << (6 * (trailingBytes - j - 1));
    }
  }

  str = str.substr(1 + trailingBytes);

  if (!valid) {
    return std::nullopt;
  }

  size_t expectedTrailing = u < 0x80       ? 0
                            : u < 0x800    ? 1
                            : u < 0x10000  ? 2
                            : u < 0x110000 ? 3
                                           : -1;
  if (trailingBytes != expectedTrailing) {
    // Overlong encoding or overlarge code point.
    return std::nullopt;
  }

  return u;
}